

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

ImplicitProducer * __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::get_or_add_implicit_producer
          (ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
           *this)

{
  __atomic_flag_data_type _Var1;
  size_t sVar2;
  undefined8 *puVar3;
  ImplicitProducerKVP *pIVar4;
  __int_type_conflict _Var5;
  atomic_flag *paVar6;
  char *pcVar7;
  __atomic_base<unsigned_long> _Var8;
  __atomic_base<unsigned_long> local_290;
  thread_id_t empty_1;
  __int_type_conflict probedKey_1;
  size_t index_1;
  ImplicitProducer *producer;
  char *pcStack_268;
  bool recycled;
  size_t i;
  ImplicitProducerHash *newHash;
  char *raw;
  size_t newCapacity;
  __int_type_conflict newCount;
  thread_id_t empty;
  ImplicitProducer *value;
  __int_type_conflict probedKey;
  size_t index;
  __pointer_type hash;
  __pointer_type mainHash;
  size_t hashedId;
  thread_id_t id;
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
  *this_local;
  memory_order local_1f0;
  int local_1ec;
  memory_order __b_5;
  memory_order local_1e0;
  int local_1dc;
  memory_order __b_4;
  int local_1cc;
  memory_order __b_2;
  undefined8 local_1c0;
  memory_order local_1b8;
  int local_1b4;
  memory_order __b_3;
  undefined8 *local_1a8;
  thread_id_t local_1a0;
  memory_order local_198;
  int local_194;
  memory_order __b_6;
  ImplicitProducer *local_188;
  memory_order local_180;
  int local_17c;
  memory_order __b_1;
  ImplicitProducer *local_170;
  memory_order local_168;
  int local_164;
  memory_order __b;
  __int_type_conflict local_158;
  undefined8 local_150;
  undefined4 local_144;
  undefined8 local_140;
  atomic<unsigned_long> *local_138;
  __int_type_conflict local_108;
  undefined8 local_100;
  undefined4 local_f4;
  undefined8 local_f0;
  atomic<unsigned_long> *local_e8;
  __int_type_conflict local_e0;
  undefined8 local_d8;
  undefined4 local_cc;
  undefined8 local_c8;
  atomic<unsigned_long> *local_c0;
  undefined4 local_b4;
  size_t local_b0;
  __atomic_base<unsigned_long> *local_a8;
  ImplicitProducerKVP *local_a0;
  undefined4 local_94;
  size_t local_90;
  __int_type_conflict *local_88;
  ImplicitProducerKVP *local_80;
  undefined4 local_74;
  atomic_flag *local_70;
  bool local_61;
  size_t local_60;
  memory_order local_58;
  undefined4 local_54;
  size_t local_50;
  __int_type_conflict *local_48;
  ImplicitProducerKVP *local_40;
  bool local_31;
  size_t local_30;
  memory_order local_28;
  undefined4 local_24;
  size_t local_20;
  __atomic_base<unsigned_long> *local_18;
  ImplicitProducerKVP *local_10;
  
  id = (thread_id_t)this;
  hashedId = details::thread_id();
  mainHash = (__pointer_type)details::hash_thread_id(hashedId);
  index = (size_t)std::
                  atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                  ::load(&this->implicitProducerHash,memory_order_acquire);
  hash = (__pointer_type)index;
  do {
    if (index == 0) {
      local_c0 = &this->implicitProducerHashCount;
      local_c8 = 1;
      local_cc = 0;
      local_d8 = 1;
      LOCK();
      local_e0 = (local_c0->super___atomic_base<unsigned_long>)._M_i;
      (local_c0->super___atomic_base<unsigned_long>)._M_i =
           (local_c0->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      newCapacity = local_e0 + 1;
      while( true ) {
        if (hash->capacity >> 1 <= newCapacity) {
          local_70 = &this->implicitProducerHashResizeInProgress;
          local_74 = 2;
          LOCK();
          _Var1 = (local_70->super___atomic_flag_base)._M_i;
          (local_70->super___atomic_flag_base)._M_i = true;
          UNLOCK();
          if (_Var1 == false) {
            hash = std::
                   atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                   ::load(&this->implicitProducerHash,memory_order_acquire);
            if (newCapacity < hash->capacity >> 1) {
              paVar6 = &this->implicitProducerHashResizeInProgress;
              local_1ec = 3;
              ___b_5 = paVar6;
              local_1f0 = std::operator&(memory_order_release,__memory_order_mask);
              if (local_1ec == 3) {
                (paVar6->super___atomic_flag_base)._M_i = false;
              }
              else if (local_1ec == 5) {
                LOCK();
                (paVar6->super___atomic_flag_base)._M_i = false;
                UNLOCK();
              }
              else {
                (paVar6->super___atomic_flag_base)._M_i = false;
              }
            }
            else {
              raw = (char *)hash->capacity;
              do {
                pcVar7 = raw;
                raw = (char *)((long)pcVar7 << 1);
              } while (((ulong)pcVar7 & 0x7fffffffffffffff) <= newCapacity);
              newHash = (ImplicitProducerHash *)
                        ConcurrentQueueDefaultTraits::malloc((long)pcVar7 * 0x20 + 0x1f);
              if (newHash == (ImplicitProducerHash *)0x0) {
                local_e8 = &this->implicitProducerHashCount;
                local_f0 = 0xffffffffffffffff;
                local_f4 = 0;
                local_100 = 0xffffffffffffffff;
                LOCK();
                local_108 = (local_e8->super___atomic_base<unsigned_long>)._M_i;
                (local_e8->super___atomic_base<unsigned_long>)._M_i =
                     (local_e8->super___atomic_base<unsigned_long>)._M_i - 1;
                UNLOCK();
                paVar6 = &this->implicitProducerHashResizeInProgress;
                local_1cc = 0;
                ___b_2 = paVar6;
                std::operator&(memory_order_relaxed,__memory_order_mask);
                if (local_1cc == 3) {
                  (paVar6->super___atomic_flag_base)._M_i = false;
                }
                else if (local_1cc == 5) {
                  LOCK();
                  (paVar6->super___atomic_flag_base)._M_i = false;
                  UNLOCK();
                }
                else {
                  (paVar6->super___atomic_flag_base)._M_i = false;
                }
                return (ImplicitProducer *)0x0;
              }
              newHash->capacity = (size_t)raw;
              i = (size_t)newHash;
              pcVar7 = details::
                       align_for<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerKVP>
                                 ((char *)(newHash + 1));
              *(char **)(i + 8) = pcVar7;
              for (pcStack_268 = (char *)0x0; pcStack_268 != raw; pcStack_268 = pcStack_268 + 1) {
                ImplicitProducerKVP::ImplicitProducerKVP
                          ((ImplicitProducerKVP *)(*(long *)(i + 8) + (long)pcStack_268 * 0x10));
                puVar3 = (undefined8 *)(*(long *)(i + 8) + (long)pcStack_268 * 0x10);
                ___b_3 = 0;
                local_1b4 = 0;
                local_1a8 = puVar3;
                local_1b8 = std::operator&(memory_order_relaxed,__memory_order_mask);
                local_1c0 = ___b_3;
                if (local_1b4 == 3) {
                  *puVar3 = ___b_3;
                }
                else if (local_1b4 == 5) {
                  LOCK();
                  *puVar3 = ___b_3;
                  UNLOCK();
                }
                else {
                  *puVar3 = ___b_3;
                }
              }
              *(__pointer_type *)(i + 0x10) = hash;
              std::
              atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
              ::store(&this->implicitProducerHash,(__pointer_type)i,memory_order_release);
              paVar6 = &this->implicitProducerHashResizeInProgress;
              local_1dc = 3;
              ___b_4 = paVar6;
              local_1e0 = std::operator&(memory_order_release,__memory_order_mask);
              if (local_1dc == 3) {
                (paVar6->super___atomic_flag_base)._M_i = false;
              }
              else if (local_1dc == 5) {
                LOCK();
                (paVar6->super___atomic_flag_base)._M_i = false;
                UNLOCK();
              }
              else {
                (paVar6->super___atomic_flag_base)._M_i = false;
              }
              hash = (__pointer_type)i;
            }
          }
        }
        if (newCapacity < (hash->capacity >> 1) + (hash->capacity >> 2)) break;
        hash = std::
               atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
               ::load(&this->implicitProducerHash,memory_order_acquire);
      }
      index_1 = (size_t)recycle_or_create_producer(this,false,(bool *)((long)&producer + 7));
      if ((ProducerBase *)index_1 == (ProducerBase *)0x0) {
        LOCK();
        (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i =
             (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i - 1;
        UNLOCK();
        return (ImplicitProducer *)0x0;
      }
      if ((producer._7_1_ & 1) != 0) {
        local_138 = &this->implicitProducerHashCount;
        local_140 = 0xffffffffffffffff;
        local_144 = 0;
        local_150 = 0xffffffffffffffff;
        LOCK();
        local_158 = (local_138->super___atomic_base<unsigned_long>)._M_i;
        (local_138->super___atomic_base<unsigned_long>)._M_i =
             (local_138->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
      }
      probedKey_1 = (__int_type_conflict)mainHash;
      do {
        probedKey_1 = probedKey_1 & hash->capacity - 1;
        pIVar4 = hash->entries + probedKey_1;
        local_194 = 0;
        ___b_6 = pIVar4;
        local_198 = std::operator&(memory_order_relaxed,__memory_order_mask);
        sVar2 = hashedId;
        if (local_194 - 1U < 2) {
          local_1a0 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
        }
        else if (local_194 == 5) {
          local_1a0 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
        }
        else {
          local_1a0 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
        }
        empty_1 = local_1a0;
        local_290._M_i = 0;
        if (local_1a0 == 0) {
          pIVar4 = hash->entries + probedKey_1;
          local_b0 = hashedId;
          local_b4 = 0;
          local_a8 = &local_290;
          local_a0 = pIVar4;
          local_28 = std::__cmpexch_failure_order(memory_order_relaxed);
          local_20 = sVar2;
          local_24 = 0;
          local_30 = sVar2;
          if (local_28 - memory_order_consume < 2) {
            LOCK();
            _Var8._M_i = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
            local_31 = local_290._M_i == _Var8._M_i;
            if (local_31) {
              (pIVar4->key).super___atomic_base<unsigned_long>._M_i = sVar2;
              _Var8._M_i = local_290._M_i;
            }
            UNLOCK();
            if (!local_31) {
              local_290._M_i = _Var8._M_i;
            }
          }
          else if (local_28 == memory_order_seq_cst) {
            LOCK();
            _Var8._M_i = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
            local_31 = local_290._M_i == _Var8._M_i;
            if (local_31) {
              (pIVar4->key).super___atomic_base<unsigned_long>._M_i = sVar2;
              _Var8._M_i = local_290._M_i;
            }
            UNLOCK();
            if (!local_31) {
              local_290._M_i = _Var8._M_i;
            }
          }
          else {
            LOCK();
            _Var8._M_i = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
            local_31 = local_290._M_i == _Var8._M_i;
            if (local_31) {
              (pIVar4->key).super___atomic_base<unsigned_long>._M_i = sVar2;
              _Var8._M_i = local_290._M_i;
            }
            UNLOCK();
            if (!local_31) {
              local_290._M_i = _Var8._M_i;
            }
          }
          local_18 = &local_290;
          local_10 = pIVar4;
          if (local_31 != false) {
            hash->entries[probedKey_1].value = (ImplicitProducer *)index_1;
            return (ImplicitProducer *)index_1;
          }
        }
        probedKey_1 = probedKey_1 + 1;
      } while( true );
    }
    probedKey = (__int_type_conflict)mainHash;
    while( true ) {
      probedKey = probedKey & *(long *)index - 1U;
      puVar3 = (undefined8 *)(*(long *)(index + 8) + probedKey * 0x10);
      local_164 = 0;
      ___b = puVar3;
      local_168 = std::operator&(memory_order_relaxed,__memory_order_mask);
      if (local_164 - 1U < 2) {
        local_170 = (ImplicitProducer *)*puVar3;
      }
      else if (local_164 == 5) {
        local_170 = (ImplicitProducer *)*puVar3;
      }
      else {
        local_170 = (ImplicitProducer *)*puVar3;
      }
      value = local_170;
      if (local_170 == (ImplicitProducer *)hashedId) {
        empty = *(thread_id_t *)(*(long *)(index + 8) + probedKey * 0x10 + 8);
        if ((__pointer_type)index == hash) {
          return (ImplicitProducer *)empty;
        }
        probedKey = (__int_type_conflict)mainHash;
        do {
          probedKey = probedKey & hash->capacity - 1;
          pIVar4 = hash->entries + probedKey;
          local_17c = 0;
          ___b_1 = pIVar4;
          local_180 = std::operator&(memory_order_relaxed,__memory_order_mask);
          sVar2 = hashedId;
          if (local_17c - 1U < 2) {
            local_188 = (ImplicitProducer *)(pIVar4->key).super___atomic_base<unsigned_long>._M_i;
          }
          else if (local_17c == 5) {
            local_188 = (ImplicitProducer *)(pIVar4->key).super___atomic_base<unsigned_long>._M_i;
          }
          else {
            local_188 = (ImplicitProducer *)(pIVar4->key).super___atomic_base<unsigned_long>._M_i;
          }
          value = local_188;
          newCount = 0;
          if (local_188 == (ImplicitProducer *)0x0) {
            pIVar4 = hash->entries + probedKey;
            local_90 = hashedId;
            local_94 = 0;
            local_88 = &newCount;
            local_80 = pIVar4;
            local_58 = std::__cmpexch_failure_order(memory_order_relaxed);
            local_50 = sVar2;
            local_54 = 0;
            local_60 = sVar2;
            if (local_58 - memory_order_consume < 2) {
              LOCK();
              _Var5 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
              local_61 = newCount == _Var5;
              if (local_61) {
                (pIVar4->key).super___atomic_base<unsigned_long>._M_i = sVar2;
                _Var5 = newCount;
              }
              UNLOCK();
              if (!local_61) {
                newCount = _Var5;
              }
            }
            else if (local_58 == memory_order_seq_cst) {
              LOCK();
              _Var5 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
              local_61 = newCount == _Var5;
              if (local_61) {
                (pIVar4->key).super___atomic_base<unsigned_long>._M_i = sVar2;
                _Var5 = newCount;
              }
              UNLOCK();
              if (!local_61) {
                newCount = _Var5;
              }
            }
            else {
              LOCK();
              _Var5 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
              local_61 = newCount == _Var5;
              if (local_61) {
                (pIVar4->key).super___atomic_base<unsigned_long>._M_i = sVar2;
                _Var5 = newCount;
              }
              UNLOCK();
              if (!local_61) {
                newCount = _Var5;
              }
            }
            local_48 = &newCount;
            local_40 = pIVar4;
            if (local_61 != false) {
              hash->entries[probedKey].value = (ImplicitProducer *)empty;
              return (ImplicitProducer *)empty;
            }
          }
          probedKey = probedKey + 1;
        } while( true );
      }
      if (local_170 == (ImplicitProducer *)0x0) break;
      probedKey = probedKey + 1;
    }
    index = *(size_t *)(index + 0x10);
  } while( true );
}

Assistant:

ImplicitProducer* get_or_add_implicit_producer()
	{
		// Note that since the data is essentially thread-local (key is thread ID),
		// there's a reduced need for fences (memory ordering is already consistent
		// for any individual thread), except for the current table itself.
		
		// Start by looking for the thread ID in the current and all previous hash tables.
		// If it's not found, it must not be in there yet, since this same thread would
		// have added it previously to one of the tables that we traversed.
		
		// Code and algorithm adapted from http://preshing.com/20130605/the-worlds-simplest-lock-free-hash-table
		
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
		debug::DebugLock lock(implicitProdMutex);
#endif
		
		auto id = details::thread_id();
		auto hashedId = details::hash_thread_id(id);
		
		auto mainHash = implicitProducerHash.load(std::memory_order_acquire);
		for (auto hash = mainHash; hash != nullptr; hash = hash->prev) {
			// Look for the id in this hash
			auto index = hashedId;
			while (true) {		// Not an infinite loop because at least one slot is free in the hash table
				index &= hash->capacity - 1;
				
				auto probedKey = hash->entries[index].key.load(std::memory_order_relaxed);
				if (probedKey == id) {
					// Found it! If we had to search several hashes deep, though, we should lazily add it
					// to the current main hash table to avoid the extended search next time.
					// Note there's guaranteed to be room in the current hash table since every subsequent
					// table implicitly reserves space for all previous tables (there's only one
					// implicitProducerHashCount).
					auto value = hash->entries[index].value;
					if (hash != mainHash) {
						index = hashedId;
						while (true) {
							index &= mainHash->capacity - 1;
							probedKey = mainHash->entries[index].key.load(std::memory_order_relaxed);
							auto empty = details::invalid_thread_id;
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
							auto reusable = details::invalid_thread_id2;
							if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed)) ||
								(probedKey == reusable && mainHash->entries[index].key.compare_exchange_strong(reusable, id, std::memory_order_acquire))) {
#else
							if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed))) {
#endif
								mainHash->entries[index].value = value;
								break;
							}
							++index;
						}
					}
					
					return value;
				}
				if (probedKey == details::invalid_thread_id) {
					break;		// Not in this hash table
				}
				++index;
			}
		}
		
		// Insert!
		auto newCount = 1 + implicitProducerHashCount.fetch_add(1, std::memory_order_relaxed);
		while (true) {
			if (newCount >= (mainHash->capacity >> 1) && !implicitProducerHashResizeInProgress.test_and_set(std::memory_order_acquire)) {
				// We've acquired the resize lock, try to allocate a bigger hash table.
				// Note the acquire fence synchronizes with the release fence at the end of this block, and hence when
				// we reload implicitProducerHash it must be the most recent version (it only gets changed within this
				// locked block).
				mainHash = implicitProducerHash.load(std::memory_order_acquire);
				if (newCount >= (mainHash->capacity >> 1)) {
					auto newCapacity = mainHash->capacity << 1;
					while (newCount >= (newCapacity >> 1)) {
						newCapacity <<= 1;
					}
					auto raw = static_cast<char*>((Traits::malloc)(sizeof(ImplicitProducerHash) + std::alignment_of<ImplicitProducerKVP>::value - 1 + sizeof(ImplicitProducerKVP) * newCapacity));
					if (raw == nullptr) {
						// Allocation failed
						implicitProducerHashCount.fetch_add(-1, std::memory_order_relaxed);
						implicitProducerHashResizeInProgress.clear(std::memory_order_relaxed);
						return nullptr;
					}
					
					auto newHash = new (raw) ImplicitProducerHash;
					newHash->capacity = newCapacity;
					newHash->entries = reinterpret_cast<ImplicitProducerKVP*>(details::align_for<ImplicitProducerKVP>(raw + sizeof(ImplicitProducerHash)));
					for (size_t i = 0; i != newCapacity; ++i) {
						new (newHash->entries + i) ImplicitProducerKVP;
						newHash->entries[i].key.store(details::invalid_thread_id, std::memory_order_relaxed);
					}
					newHash->prev = mainHash;
					implicitProducerHash.store(newHash, std::memory_order_release);
					implicitProducerHashResizeInProgress.clear(std::memory_order_release);
					mainHash = newHash;
				}
				else {
					implicitProducerHashResizeInProgress.clear(std::memory_order_release);
				}
			}
			
			// If it's < three-quarters full, add to the old one anyway so that we don't have to wait for the next table
			// to finish being allocated by another thread (and if we just finished allocating above, the condition will
			// always be true)
			if (newCount < (mainHash->capacity >> 1) + (mainHash->capacity >> 2)) {
				bool recycled;
				auto producer = static_cast<ImplicitProducer*>(recycle_or_create_producer(false, recycled));
				if (producer == nullptr) {
					implicitProducerHashCount.fetch_add(-1, std::memory_order_relaxed);
					return nullptr;
				}
				if (recycled) {
					implicitProducerHashCount.fetch_add(-1, std::memory_order_relaxed);
				}
				
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
				producer->threadExitListener.callback = &ConcurrentQueue::implicit_producer_thread_exited_callback;
				producer->threadExitListener.userData = producer;
				details::ThreadExitNotifier::subscribe(&producer->threadExitListener);
#endif
				
				auto index = hashedId;
				while (true) {
					index &= mainHash->capacity - 1;
					auto probedKey = mainHash->entries[index].key.load(std::memory_order_relaxed);
					
					auto empty = details::invalid_thread_id;
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
					auto reusable = details::invalid_thread_id2;
					if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed)) ||
						(probedKey == reusable && mainHash->entries[index].key.compare_exchange_strong(reusable, id, std::memory_order_acquire))) {
#else
					if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed))) {
#endif
						mainHash->entries[index].value = producer;
						break;
					}
					++index;
				}
				return producer;
			}
			
			// Hmm, the old hash is quite full and somebody else is busy allocating a new one.
			// We need to wait for the allocating thread to finish (if it succeeds, we add, if not,
			// we try to allocate ourselves).
			mainHash = implicitProducerHash.load(std::memory_order_acquire);
		}
	}
	
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
	void implicit_producer_thread_exited(ImplicitProducer* producer)
	{
		// Remove from thread exit listeners
		details::ThreadExitNotifier::unsubscribe(&producer->threadExitListener);
		
		// Remove from hash
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
		debug::DebugLock lock(implicitProdMutex);
#endif
		auto hash = implicitProducerHash.load(std::memory_order_acquire);
		assert(hash != nullptr);		// The thread exit listener is only registered if we were added to a hash in the first place
		auto id = details::thread_id();
		auto hashedId = details::hash_thread_id(id);
		details::thread_id_t probedKey;
		
		// We need to traverse all the hashes just in case other threads aren't on the current one yet and are
		// trying to add an entry thinking there's a free slot (because they reused a producer)
		for (; hash != nullptr; hash = hash->prev) {
			auto index = hashedId;
			do {
				index &= hash->capacity - 1;
				probedKey = hash->entries[index].key.load(std::memory_order_relaxed);
				if (probedKey == id) {
					hash->entries[index].key.store(details::invalid_thread_id2, std::memory_order_release);
					break;
				}
				++index;
			} while (probedKey != details::invalid_thread_id);		// Can happen if the hash has changed but we weren't put back in it yet, or if we weren't added to this hash in the first place
		}
		
		// Mark the queue as being recyclable
		producer->inactive.store(true, std::memory_order_release);
	}
	
	static void implicit_producer_thread_exited_callback(void* userData)
	{
		auto producer = static_cast<ImplicitProducer*>(userData);
		auto queue = producer->parent;
		queue->implicit_producer_thread_exited(producer);
	}
#endif
	
	//////////////////////////////////
	// Utility functions
	//////////////////////////////////
	
	template<typename U>
	static inline U* create_array(size_t count)
	{
		assert(count > 0);
		auto p = static_cast<U*>((Traits::malloc)(sizeof(U) * count));
		if (p == nullptr) {
			return nullptr;
		}
		
		for (size_t i = 0; i != count; ++i) {
			new (p + i) U();
		}
		return p;
	}
	
	template<typename U>
	static inline void destroy_array(U* p, size_t count)
	{
		if (p != nullptr) {
			assert(count > 0);
			for (size_t i = count; i != 0; ) {
				(p + --i)->~U();
			}
			(Traits::free)(p);
		}
	}
	
	template<typename U>
	static inline U* create()
	{
		auto p = (Traits::malloc)(sizeof(U));
		return p != nullptr ? new (p) U : nullptr;
	}
	
	template<typename U, typename A1>
	static inline U* create(A1&& a1)
	{
		auto p = (Traits::malloc)(sizeof(U));
		return p != nullptr ? new (p) U(std::forward<A1>(a1)) : nullptr;
	}
	
	template<typename U>
	static inline void destroy(U* p)
	{
		if (p != nullptr) {
			p->~U();
		}
		(Traits::free)(p);
	}

private:
	std::atomic<ProducerBase*> producerListTail;
	std::atomic<std::uint32_t> producerCount;
	
	std::atomic<size_t> initialBlockPoolIndex;
	Block* initialBlockPool;
	size_t initialBlockPoolSize;
	
#if !MCDBGQ_USEDEBUGFREELIST
	FreeList<Block> freeList;
#else
	debug::DebugFreeList<Block> freeList;
#endif
	
	std::atomic<ImplicitProducerHash*> implicitProducerHash;
	std::atomic<size_t> implicitProducerHashCount;		// Number of slots logically used
	ImplicitProducerHash initialImplicitProducerHash;
	std::array<ImplicitProducerKVP, INITIAL_IMPLICIT_PRODUCER_HASH_SIZE> initialImplicitProducerHashEntries;
	std::atomic_flag implicitProducerHashResizeInProgress;
	
	std::atomic<std::uint32_t> nextExplicitConsumerId;
	std::atomic<std::uint32_t> globalExplicitConsumerOffset;
	
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
	debug::DebugMutex implicitProdMutex;
#endif
	
#ifdef MOODYCAMEL_QUEUE_INTERNAL_DEBUG
	std::atomic<ExplicitProducer*> explicitProducers;
	std::atomic<ImplicitProducer*> implicitProducers;
#endif
};


template<typename T, typename Traits>
ProducerToken::ProducerToken(ConcurrentQueue<T, Traits>& queue)
	: producer(queue.recycle_or_create_producer(true))
{
	if (producer != nullptr) {
		producer->token = this;
	}
}

template<typename T, typename Traits>
ProducerToken::ProducerToken(BlockingConcurrentQueue<T, Traits>& queue)
	: producer(reinterpret_cast<ConcurrentQueue<T, Traits>*>(&queue)->recycle_or_create_producer(true))
{
	if (producer != nullptr) {
		producer->token = this;
	}
}

template<typename T, typename Traits>
ConsumerToken::ConsumerToken(ConcurrentQueue<T, Traits>& queue)
	: itemsConsumedFromCurrent(0), currentProducer(nullptr), desiredProducer(nullptr)
{
	initialOffset = queue.nextExplicitConsumerId.fetch_add(1, std::memory_order_release);
	lastKnownGlobalOffset = -1;
}

template<typename T, typename Traits>
ConsumerToken::ConsumerToken(BlockingConcurrentQueue<T, Traits>& queue)
	: itemsConsumedFromCurrent(0), currentProducer(nullptr), desiredProducer(nullptr)
{
	initialOffset = reinterpret_cast<ConcurrentQueue<T, Traits>*>(&queue)->nextExplicitConsumerId.fetch_add(1, std::memory_order_release);
	lastKnownGlobalOffset = -1;
}

template<typename T, typename Traits>
inline void swap(ConcurrentQueue<T, Traits>& a, ConcurrentQueue<T, Traits>& b) MOODYCAMEL_NOEXCEPT
{
	a.swap(b);
}

inline void swap(ProducerToken& a, ProducerToken& b) MOODYCAMEL_NOEXCEPT
{
	a.swap(b);
}

inline void swap(ConsumerToken& a, ConsumerToken& b) MOODYCAMEL_NOEXCEPT
{
	a.swap(b);
}

template<typename T, typename Traits>
inline void swap(typename ConcurrentQueue<T, Traits>::ImplicitProducerKVP& a, typename ConcurrentQueue<T, Traits>::ImplicitProducerKVP& b) MOODYCAMEL_NOEXCEPT
{
	a.swap(b);
}

}